

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O1

void slang::ast::UninstantiatedDefSymbol::fromSyntax
               (Compilation *compilation,HierarchyInstantiationSyntax *syntax,
               HierarchicalInstanceSyntax *specificInstance,ASTContext *parentContext,
               SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets,
               SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
               *implicitNetNames,NetType *netType)

{
  HierarchicalInstanceSyntax *instanceSyntax;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar1;
  ASTContext *context_00;
  ulong uVar2;
  long lVar3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> params;
  string_view sVar4;
  ASTContext context;
  
  ASTContext::resetFlags
            ((ASTContext *)&stack0xffffffffffffff98,parentContext,
             (bitmask<slang::ast::ASTFlags>)0x20);
  params = createUninstantiatedParams
                     ((ast *)syntax,(HierarchyInstantiationSyntax *)&stack0xffffffffffffff98,
                      context_00);
  if (specificInstance == (HierarchicalInstanceSyntax *)0x0) {
    uVar2 = (syntax->instances).elements._M_extent._M_extent_value + 1;
    if (1 < uVar2) {
      uVar2 = uVar2 >> 1;
      lVar3 = 0;
      do {
        ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             ((long)&(((syntax->instances).elements._M_ptr)->
                                     super_ConstTokenOrSyntax).
                                     super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                             + lVar3));
        instanceSyntax = (HierarchicalInstanceSyntax *)*ppSVar1;
        sVar4 = parsing::Token::valueText(&syntax->type);
        createUninstantiatedDef<slang::syntax::HierarchyInstantiationSyntax>
                  (compilation,syntax,instanceSyntax,sVar4,(ASTContext *)&stack0xffffffffffffff98,
                   params,results,implicitNets,implicitNetNames,netType);
        lVar3 = lVar3 + 0x30;
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
  }
  else {
    sVar4 = parsing::Token::valueText(&syntax->type);
    createUninstantiatedDef<slang::syntax::HierarchyInstantiationSyntax>
              (compilation,syntax,specificInstance,sVar4,(ASTContext *)&stack0xffffffffffffff98,
               params,results,implicitNets,implicitNetNames,netType);
  }
  return;
}

Assistant:

void UninstantiatedDefSymbol::fromSyntax(
    Compilation& compilation, const syntax::HierarchyInstantiationSyntax& syntax,
    const syntax::HierarchicalInstanceSyntax* specificInstance, const ASTContext& parentContext,
    SmallVectorBase<const Symbol*>& results, SmallVectorBase<const Symbol*>& implicitNets,
    SmallSet<std::string_view, 8>& implicitNetNames, const NetType& netType) {

    ASTContext context = parentContext.resetFlags(ASTFlags::NonProcedural);
    auto params = createUninstantiatedParams(syntax, context);

    if (specificInstance) {
        createUninstantiatedDef(compilation, syntax, specificInstance, syntax.type.valueText(),
                                context, params, results, implicitNets, implicitNetNames, netType);
    }
    else {
        for (auto instanceSyntax : syntax.instances) {
            createUninstantiatedDef(compilation, syntax, instanceSyntax, syntax.type.valueText(),
                                    context, params, results, implicitNets, implicitNetNames,
                                    netType);
        }
    }
}